

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<long_long,_unsigned_long,_4>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (longlong *t,unsigned_long *u,longlong *result)

{
  uint64_t uVar1;
  ulong uVar2;
  
  if (*u != 0) {
    uVar2 = *t;
    if ((long)uVar2 < 0) {
      uVar1 = AbsValueHelper<long_long,_1>::Abs(uVar2);
      uVar2 = -(uVar1 % *u);
    }
    else {
      uVar2 = uVar2 % *u;
    }
    *result = uVar2;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //t could be negative - if so, need to convert to positive
        if(t < 0)
            result = (T)( ~( AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( t ) % u ) + 1);
        else
            result = (T)( (T)t % u );
    }